

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::UntypedPerformAction
          (FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<cv::Mat> *pAVar1;
  ArgumentTuple *args;
  Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *this_local;
  
  action.impl_.link_.next_ = (linked_ptr_internal *)untyped_args;
  Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::Action
            ((Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *)&args,
             (Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *)untyped_action);
  pAVar1 = ActionResultHolder<cv::Mat>::PerformAction<cv::Mat(cv::Mat,cv::Rect_<int>)>
                     ((Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *)&args,
                      (ArgumentTuple *)action.impl_.link_.next_);
  Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::~Action
            ((Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *)&args);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }